

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_iter.c
# Opt level: O3

tnt_iter * tnt_iter_reply(tnt_iter *i,tnt_stream *s)

{
  bool bVar1;
  
  bVar1 = i == (tnt_iter *)0x0;
  if ((bVar1) && (i = (tnt_iter *)tnt_mem_alloc(0xa8), i == (tnt_iter *)0x0)) {
    return (tnt_iter *)0x0;
  }
  memset(i,0,0xa8);
  i->alloc = (uint)bVar1;
  i->type = TNT_ITER_REPLY;
  i->next = tnt_iter_reply_next;
  i->free = tnt_iter_reply_free;
  (i->data).reply.s = s;
  tnt_reply_init(&(i->data).reply.r);
  return i;
}

Assistant:

struct tnt_iter *tnt_iter_reply(struct tnt_iter *i, struct tnt_stream *s) {
	i = tnt_iter_init(i);
	if (i == NULL)
		return NULL;
	i->type = TNT_ITER_REPLY;
	i->next = tnt_iter_reply_next;
	i->rewind = NULL;
	i->free = tnt_iter_reply_free;
	struct tnt_iter_reply *ir = TNT_IREPLY(i);
	ir->s = s;
	tnt_reply_init(&ir->r);
	return i;
}